

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_send(nghttp2_session *session)

{
  nghttp2_ssize nVar1;
  long in_RDI;
  nghttp2_bufs *framebufs;
  nghttp2_ssize sentlen;
  nghttp2_ssize datalen;
  uint8_t *data;
  int in_stack_0000005c;
  uint8_t **in_stack_00000060;
  nghttp2_session *in_stack_00000068;
  long local_28;
  
  while( true ) {
    nVar1 = nghttp2_session_mem_send_internal(in_stack_00000068,in_stack_00000060,in_stack_0000005c)
    ;
    if (nVar1 < 1) {
      return (int)nVar1;
    }
    if (*(long *)(in_RDI + 0x930) == 0) {
      local_28 = (**(code **)(in_RDI + 0x928))(in_RDI,0,nVar1,0,*(undefined8 *)(in_RDI + 0xa30));
    }
    else {
      local_28 = (**(code **)(in_RDI + 0x930))(in_RDI,0,nVar1,0,*(undefined8 *)(in_RDI + 0xa30));
    }
    if (local_28 < 0) break;
    *(long *)(*(long *)(in_RDI + 0x298) + 0x18) =
         *(long *)(*(long *)(in_RDI + 0x298) + 0x18) - (nVar1 - local_28);
  }
  if (local_28 == -0x1f8) {
    *(long *)(*(long *)(in_RDI + 0x298) + 0x18) =
         *(long *)(*(long *)(in_RDI + 0x298) + 0x18) - nVar1;
    return 0;
  }
  return -0x386;
}

Assistant:

int nghttp2_session_send(nghttp2_session *session) {
  const uint8_t *data = NULL;
  nghttp2_ssize datalen;
  nghttp2_ssize sentlen;
  nghttp2_bufs *framebufs;

  framebufs = &session->aob.framebufs;

  for (;;) {
    datalen = nghttp2_session_mem_send_internal(session, &data, 0);
    if (datalen <= 0) {
      return (int)datalen;
    }
    if (session->callbacks.send_callback2) {
      sentlen = session->callbacks.send_callback2(
        session, data, (size_t)datalen, 0, session->user_data);
    } else {
      sentlen = (nghttp2_ssize)session->callbacks.send_callback(
        session, data, (size_t)datalen, 0, session->user_data);
    }
    if (sentlen < 0) {
      if (sentlen == NGHTTP2_ERR_WOULDBLOCK) {
        /* Transmission canceled. Rewind the offset */
        framebufs->cur->buf.pos -= datalen;

        return 0;
      }
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
    /* Rewind the offset to the amount of unsent bytes */
    framebufs->cur->buf.pos -= datalen - sentlen;
  }
}